

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

void leb_ResetToDepth(leb_Heap *leb,int depth)

{
  int iVar1;
  uint32_t *puVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint32_t nodeID;
  uint uVar7;
  uint uVar8;
  
  if (depth < leb->minDepth) {
    __assert_fail("depth >= leb->minDepth && \"depth must be at least equal to minDepth\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x270,"void leb_ResetToDepth(leb_Heap *, int)");
  }
  bVar3 = (byte)depth;
  if (leb->maxDepth < depth) {
    __assert_fail("depth <= leb->maxDepth && \"depth must be at most equal to maxDepth\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x271,"void leb_ResetToDepth(leb_Heap *, int)");
  }
  uVar7 = 1 << (bVar3 & 0x1f);
  uVar8 = 2 << (bVar3 & 0x1f);
  memset(leb->buffer,0,(ulong)((uint)(1 << ((char)leb->maxDepth + 2U & 0x1f)) >> 3 & 0xfffffffc));
  if (uVar7 < uVar8) {
    puVar2 = leb->buffer;
    do {
      iVar1 = leb->maxDepth;
      bVar6 = (char)iVar1 - bVar3;
      iVar4 = iVar1;
      if (depth == uVar7) {
        bVar6 = 0;
        iVar4 = depth;
      }
      uVar5 = ((iVar1 - iVar4) + 1) * (uVar7 << (bVar6 & 0x1f)) + (2 << ((byte)iVar4 & 0x1f));
      puVar2[uVar5 >> 5] = puVar2[uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  leb_ComputeSumReduction(leb);
  return;
}

Assistant:

LEBDEF void leb_ResetToDepth(leb_Heap *leb, int depth)
{
    LEB_ASSERT(depth >= leb->minDepth && "depth must be at least equal to minDepth");
    LEB_ASSERT(depth <= leb->maxDepth && "depth must be at most equal to maxDepth");
    uint32_t minNodeID = 1u << depth;
    uint32_t maxNodeID = 2u << depth;

    leb__ClearBuffer(leb);

    for (uint32_t nodeID = minNodeID; nodeID < maxNodeID; ++nodeID) {
        leb_Node node = {nodeID, depth};

        leb__HeapWrite_BitField(leb, node, 1u);
    }

    leb_ComputeSumReduction(leb);
}